

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_iceguy.cpp
# Opt level: O3

int AF_A_IceGuyDie(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  long lVar5;
  undefined4 in_register_00000014;
  ulong uVar6;
  FString *this;
  VMValue *pVVar7;
  char *__assertion;
  undefined8 *puVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  VMValue params [3];
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  undefined8 *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  uVar6 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005e464d;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar8 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar8 == (undefined8 *)0x0) {
LAB_005e44ad:
        puVar8 = (undefined8 *)0x0;
        pVVar7 = param;
      }
      else {
        auVar11._8_8_ = uVar6;
        auVar11._0_8_ = puVar8[1];
        if (puVar8[1] == 0) {
          auVar11 = (**(code **)*puVar8)(puVar8);
          puVar8[1] = auVar11._0_8_;
        }
        pPVar4 = auVar11._0_8_;
        bVar9 = pPVar4 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar9;
        uVar6 = (ulong)bVar9;
        bVar10 = pPVar4 == pPVar3;
        if (!bVar10 && !bVar9) {
          do {
            pPVar4 = pPVar4->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar4 != (PClass *)0x0);
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        pVVar7 = (VMValue *)(ulong)(bVar10 || bVar9);
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005e464d;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005e4575;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005e463d;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar4 = (PClass *)puVar2[1];
            if (pPVar4 == (PClass *)0x0) {
              pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar7,uVar6,ret);
              puVar2[1] = pPVar4;
            }
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 != pPVar3 && bVar9) {
              do {
                pPVar4 = pPVar4->ParentClass;
                bVar9 = pPVar4 != (PClass *)0x0;
                if (pPVar4 == pPVar3) break;
              } while (pPVar4 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005e464d;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005e463d;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005e4575:
        puVar8[0x15] = 0;
        puVar8[0x16] = 0;
        puVar8[0x17] = 0;
        lVar5 = puVar8[1];
        if (lVar5 == 0) {
          lVar5 = (**(code **)*puVar8)(puVar8);
          puVar8[1] = lVar5;
        }
        puVar8[0x2c] = *(undefined8 *)(*(long *)(lVar5 + 200) + 0x160);
        local_68.field_1.atag = 1;
        local_68.field_3.Type = '\x03';
        local_50 = 1;
        local_4c = 3;
        local_48.Chars = (char *)0x0;
        local_40 = 8;
        local_3c[0] = 3;
        local_68.field_1.a = puVar8;
        local_58 = puVar8;
        VMFrameStack::Call(stack,&A_FreezeDeathChunks_VMPtr->super_VMFunction,
                           (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0);
        lVar5 = -0x30;
        this = &local_48;
        do {
          if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
            FString::~FString(this);
          }
          this = this + -2;
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005e464d;
    }
    if (puVar8 == (undefined8 *)0x0) goto LAB_005e44ad;
  }
LAB_005e463d:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005e464d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                ,0x65,"int AF_A_IceGuyDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceGuyDie)
{
	PARAM_ACTION_PROLOGUE;

	self->Vel.Zero();
	self->Height = self->GetDefault()->Height;
	CALL_ACTION(A_FreezeDeathChunks, self);
	return 0;
}